

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::analysis::Function::str_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  string *psVar3;
  long lVar4;
  long lVar5;
  ostringstream oss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppTVar1 = (this->param_types_).
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppTVar2 = (this->param_types_).
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
  if (ppTVar1 != ppTVar2) {
    lVar5 = (long)ppTVar1 - (long)ppTVar2 >> 3;
    lVar4 = 0;
    do {
      (*(this->param_types_).
        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar4]->_vptr_Type[3])(&local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1d0,local_1c8);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      if (lVar5 + -1 != lVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") -> ",5);
  (*this->return_type_->_vptr_Type[3])(&local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_1d0,local_1c8);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  psVar3 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string Function::str() const {
  std::ostringstream oss;
  const size_t count = param_types_.size();
  oss << "(";
  for (size_t i = 0; i < count; ++i) {
    oss << param_types_[i]->str();
    if (i + 1 != count) oss << ", ";
  }
  oss << ") -> " << return_type_->str();
  return oss.str();
}